

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QWidget *parent)

{
  QDateTimeEditPrivate *pQVar1;
  long in_FS_OFFSET;
  QDate QStack_58;
  QDateTime local_50 [8];
  Data local_48 [4];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QDateTimeEditPrivate *)operator_new(0x510);
  local_48[0] = (Data)0x1;
  QDateTimeEditPrivate::QDateTimeEditPrivate(pQVar1,(QTimeZone *)&local_48[0].s);
  QAbstractSpinBox::QAbstractSpinBox
            ((QAbstractSpinBox *)this,(QAbstractSpinBoxPrivate *)pQVar1,parent);
  QTimeZone::~QTimeZone((QTimeZone *)&local_48[0].s);
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_007cae28;
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QDateTimeEdit_007cb018;
  pQVar1 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  QDate::QDate(&QStack_58,2000,1,1);
  QDate::startOfDay();
  ::QVariant::QVariant((QVariant *)&local_48[0].s,local_50);
  QDateTimeEditPrivate::init(pQVar1,(EVP_PKEY_CTX *)&local_48[0].s);
  ::QVariant::~QVariant((QVariant *)&local_48[0].s);
  QDateTime::~QDateTime(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEdit::QDateTimeEdit(QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate, parent)
{
    Q_D(QDateTimeEdit);
    d->init(QDATETIMEEDIT_DATE_INITIAL.startOfDay());
}